

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

void __thiscall
clipp::detail::
formatting_ostream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::formatting_ostream
          (formatting_ostream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *os)

{
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *os_local;
  formatting_ostream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  this->os_ = os;
  this->curCol_ = 0;
  this->firstCol_ = 0;
  this->lastCol_ = 100;
  this->hangingIndent_ = 0;
  this->paragraphSpacing_ = 0;
  this->paragraphSpacingThreshold_ = 2;
  this->curBlankLines_ = 0;
  this->curParagraphLines_ = 1;
  this->totalNonBlankLines_ = 0;
  this->ignoreInputNls_ = false;
  return;
}

Assistant:

formatting_ostream(OStream& os):
        os_(os),
        curCol_{0}, firstCol_{0}, lastCol_{100},
        hangingIndent_{0}, paragraphSpacing_{0}, paragraphSpacingThreshold_{2},
        curBlankLines_{0}, curParagraphLines_{1},
        totalNonBlankLines_{0},
        ignoreInputNls_{false}
    {}